

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O1

void dump_hex(uint8_t *data,size_t len)

{
  uint8_t uVar1;
  size_t sVar2;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t ascii [32];
  uint8_t local_58 [40];
  
  puVar4 = local_58;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  if (len != 0) {
    uVar3 = 0;
    do {
      if ((uVar3 & 0xf) == 0) {
        if (uVar3 != 0) {
          *puVar4 = '\0';
          printf("%s",local_58);
        }
        printf("\n\t%03zu: ",uVar3);
        puVar4 = local_58;
      }
      printf("%02x, ",(ulong)data[uVar3]);
      uVar1 = data[uVar3];
      if (0x5e < (byte)(data[uVar3] - 0x20)) {
        uVar1 = '.';
      }
      *puVar4 = uVar1;
      puVar4 = puVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
    *puVar4 = '\0';
    if (local_58[0] != '\0') {
      sVar2 = strnlen((char *)local_58,0x20);
      if (sVar2 != 0x10) {
        uVar3 = 0;
        do {
          printf("    ");
          uVar3 = uVar3 + 1;
          sVar2 = strnlen((char *)local_58,0x20);
        } while (uVar3 < 0x10 - sVar2);
      }
      printf("%s",local_58);
    }
  }
  putchar(10);
  return;
}

Assistant:

void dump_hex(const uint8_t *data, size_t len) {
    uint8_t  ascii[32] = { 0 };
    uint8_t *pascii    = ascii;

    if (len > 0) {
        size_t i;

        for (i = 0; i < len; i++) {
            if (i % 16 == 0) {
                if (i > 0) {
                    *pascii++ = '\0';
                    printf("%s", ascii);
                }
                printf("\n\t%03zu: ", i);
                pascii = ascii;
            }
            printf("%02x, ", data[i]);

            if ((data[i] >= 0x20) && (data[i] < 0x7F)) {
                *pascii++ = data[i];
            } else {
                *pascii++ = '.';
            }
        }
        *pascii++ = '\0';

        if (strnlen((char *)ascii, sizeof(ascii)) > 0) {
            for (i = 0; i < 16 - strnlen((char *)ascii, sizeof(ascii)); i++) {
                printf("    ");
            }
            printf("%s", ascii);
        }
    }
    printf("\n");
}